

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

Curl_addrinfo * get_localhost(int port,char *name)

{
  sockaddr *psVar1;
  int iVar2;
  Curl_addrinfo *pCVar3;
  uint local_54;
  undefined2 uStack_50;
  unsigned_short port16;
  uint ipv4;
  sockaddr_in sa;
  size_t hostlen;
  size_t ss_size;
  Curl_addrinfo *ca6;
  Curl_addrinfo *ca;
  char *name_local;
  Curl_addrinfo *pCStack_10;
  int port_local;
  
  sa.sin_zero = (uchar  [8])strlen(name);
  memset(&uStack_50,0,0x10);
  uStack_50 = 2;
  port16 = htons((uint16_t)port);
  iVar2 = inet_pton(2,"127.0.0.1",&local_54);
  if (iVar2 < 1) {
    pCStack_10 = (Curl_addrinfo *)0x0;
  }
  else {
    ipv4 = local_54;
    pCStack_10 = (Curl_addrinfo *)(*Curl_ccalloc)(1,(long)sa.sin_zero + 0x41);
    if (pCStack_10 == (Curl_addrinfo *)0x0) {
      pCStack_10 = (Curl_addrinfo *)0x0;
    }
    else {
      pCStack_10->ai_flags = 0;
      pCStack_10->ai_family = 2;
      pCStack_10->ai_socktype = 1;
      pCStack_10->ai_protocol = 6;
      pCStack_10->ai_addrlen = 0x10;
      pCStack_10->ai_addr = (sockaddr *)(pCStack_10 + 1);
      psVar1 = pCStack_10->ai_addr;
      psVar1->sa_family = uStack_50;
      psVar1->sa_data[0] = (char)port16;
      psVar1->sa_data[1] = (char)(port16 >> 8);
      psVar1->sa_data[2] = (char)ipv4;
      psVar1->sa_data[3] = (char)(ipv4 >> 8);
      psVar1->sa_data[4] = (char)(ipv4 >> 0x10);
      psVar1->sa_data[5] = (char)(ipv4 >> 0x18);
      *(undefined8 *)(psVar1->sa_data + 6) = sa._0_8_;
      pCStack_10->ai_canonname = (char *)(pCStack_10->ai_addr + 1);
      strcpy(pCStack_10->ai_canonname,name);
      pCVar3 = get_localhost6(port,name);
      if (pCVar3 != (Curl_addrinfo *)0x0) {
        pCVar3->ai_next = pCStack_10;
        pCStack_10 = pCVar3;
      }
    }
  }
  return pCStack_10;
}

Assistant:

static struct Curl_addrinfo *get_localhost(int port, const char *name)
{
  struct Curl_addrinfo *ca;
  struct Curl_addrinfo *ca6;
  const size_t ss_size = sizeof(struct sockaddr_in);
  const size_t hostlen = strlen(name);
  struct sockaddr_in sa;
  unsigned int ipv4;
  unsigned short port16 = (unsigned short)(port & 0xffff);

  /* memset to clear the sa.sin_zero field */
  memset(&sa, 0, sizeof(sa));
  sa.sin_family = AF_INET;
  sa.sin_port = htons(port16);
  if(Curl_inet_pton(AF_INET, "127.0.0.1", (char *)&ipv4) < 1)
    return NULL;
  memcpy(&sa.sin_addr, &ipv4, sizeof(ipv4));

  ca = calloc(1, sizeof(struct Curl_addrinfo) + ss_size + hostlen + 1);
  if(!ca)
    return NULL;
  ca->ai_flags     = 0;
  ca->ai_family    = AF_INET;
  ca->ai_socktype  = SOCK_STREAM;
  ca->ai_protocol  = IPPROTO_TCP;
  ca->ai_addrlen   = (curl_socklen_t)ss_size;
  ca->ai_addr = (void *)((char *)ca + sizeof(struct Curl_addrinfo));
  memcpy(ca->ai_addr, &sa, ss_size);
  ca->ai_canonname = (char *)ca->ai_addr + ss_size;
  strcpy(ca->ai_canonname, name);

  ca6 = get_localhost6(port, name);
  if(!ca6)
    return ca;
  ca6->ai_next = ca;
  return ca6;
}